

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseStringCharRef(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlChar *pxVar1;
  int local_30;
  byte local_29;
  int val;
  xmlChar cur;
  xmlChar *ptr;
  xmlChar **str_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_30 = 0;
  if ((str == (xmlChar **)0x0) || (*str == (xmlChar *)0x0)) {
    return 0;
  }
  pxVar1 = *str;
  if (((*pxVar1 == '&') && (pxVar1[1] == '#')) && (pxVar1[2] == 'x')) {
    _val = pxVar1 + 3;
    local_29 = *_val;
    while (local_29 != 0x3b) {
      if ((local_29 < 0x30) || (0x39 < local_29)) {
        if ((local_29 < 0x61) || (0x66 < local_29)) {
          if ((local_29 < 0x41) || (0x46 < local_29)) {
            xmlFatalErr(ctxt,XML_ERR_INVALID_HEX_CHARREF,(char *)0x0);
            local_30 = 0;
            break;
          }
          local_30 = local_30 * 0x10 + (uint)local_29 + -0x37;
        }
        else {
          local_30 = local_30 * 0x10 + (uint)local_29 + -0x57;
        }
      }
      else {
        local_30 = local_30 * 0x10 + (local_29 - 0x30);
      }
      if (0x110000 < local_30) {
        local_30 = 0x110000;
      }
      _val = _val + 1;
      local_29 = *_val;
    }
    if (local_29 == 0x3b) {
      _val = _val + 1;
    }
  }
  else {
    if ((*pxVar1 != '&') || (pxVar1[1] != '#')) {
      xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
      return 0;
    }
    _val = pxVar1 + 2;
    local_29 = *_val;
    while (local_29 != 0x3b) {
      if ((local_29 < 0x30) || (0x39 < local_29)) {
        xmlFatalErr(ctxt,XML_ERR_INVALID_DEC_CHARREF,(char *)0x0);
        local_30 = 0;
        break;
      }
      local_30 = local_30 * 10 + (local_29 - 0x30);
      if (0x110000 < local_30) {
        local_30 = 0x110000;
      }
      _val = _val + 1;
      local_29 = *_val;
    }
    if (local_29 == 0x3b) {
      _val = _val + 1;
    }
  }
  *str = _val;
  if (local_30 < 0x110000) {
    if (local_30 < 0x100) {
      if ((((8 < local_30) && (local_30 < 0xb)) || (local_30 == 0xd)) || (0x1f < local_30)) {
        return local_30;
      }
    }
    else {
      if ((0xff < local_30) && (local_30 < 0xd800)) {
        return local_30;
      }
      if ((0xdfff < local_30) && (local_30 < 0xfffe)) {
        return local_30;
      }
      if ((0xffff < local_30) && (local_30 < 0x110000)) {
        return local_30;
      }
    }
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"xmlParseStringCharRef: invalid xmlChar value %d\n",
                      local_30);
  }
  else {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                      "xmlParseStringCharRef: character reference out of bounds\n",local_30);
  }
  return 0;
}

Assistant:

static int
xmlParseStringCharRef(xmlParserCtxtPtr ctxt, const xmlChar **str) {
    const xmlChar *ptr;
    xmlChar cur;
    int val = 0;

    if ((str == NULL) || (*str == NULL)) return(0);
    ptr = *str;
    cur = *ptr;
    if ((cur == '&') && (ptr[1] == '#') && (ptr[2] == 'x')) {
	ptr += 3;
	cur = *ptr;
	while (cur != ';') { /* Non input consuming loop */
	    if ((cur >= '0') && (cur <= '9'))
	        val = val * 16 + (cur - '0');
	    else if ((cur >= 'a') && (cur <= 'f'))
	        val = val * 16 + (cur - 'a') + 10;
	    else if ((cur >= 'A') && (cur <= 'F'))
	        val = val * 16 + (cur - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    ptr++;
	    cur = *ptr;
	}
	if (cur == ';')
	    ptr++;
    } else if  ((cur == '&') && (ptr[1] == '#')){
	ptr += 2;
	cur = *ptr;
	while (cur != ';') { /* Non input consuming loops */
	    if ((cur >= '0') && (cur <= '9'))
	        val = val * 10 + (cur - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    ptr++;
	    cur = *ptr;
	}
	if (cur == ';')
	    ptr++;
    } else {
	xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
	return(0);
    }
    *str = ptr;

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseStringCharRef: character reference out of bounds\n",
                val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
			  "xmlParseStringCharRef: invalid xmlChar value %d\n",
			  val);
    }
    return(0);
}